

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbisfile.c
# Opt level: O1

long ov_bitrate(OggVorbis_File *vf,int i)

{
  long *plVar1;
  uint uVar2;
  long lVar3;
  vorbis_info *pvVar4;
  ulong uVar5;
  ulong uVar6;
  int i_00;
  long lVar7;
  float fVar8;
  double dVar9;
  double dVar10;
  
  uVar6 = (ulong)(uint)i;
  while( true ) {
    uVar5 = uVar6;
    if (vf->ready_state < 2) {
      return -0x83;
    }
    uVar2 = vf->links;
    i_00 = (int)uVar5;
    if ((int)uVar2 <= i_00) break;
    if ((i_00 == 0) || (uVar6 = 0, vf->seekable != 0)) {
      if (i_00 < 0) {
        if ((int)uVar2 < 1) {
          dVar9 = 0.0;
        }
        else {
          uVar6 = 0;
          lVar7 = 0;
          do {
            lVar3 = uVar6 + 1;
            plVar1 = vf->dataoffsets + uVar6;
            uVar6 = uVar6 + 1;
            lVar7 = lVar7 + (vf->offsets[lVar3] - *plVar1) * 8;
          } while (uVar2 != uVar6);
          dVar9 = (double)lVar7;
        }
        dVar10 = ov_time_total(vf,-1);
        fVar8 = rintf((float)(dVar9 / dVar10));
        uVar6 = (ulong)fVar8;
      }
      else if (vf->seekable == 0) {
        pvVar4 = vf->vi;
        uVar6 = pvVar4[uVar5].bitrate_nominal;
        if ((long)uVar6 < 1) {
          uVar6 = pvVar4[uVar5].bitrate_upper;
          if ((long)uVar6 < 1) {
            uVar6 = 0xffffffffffffffff;
          }
          else if (0 < pvVar4[uVar5].bitrate_lower) {
            uVar6 = pvVar4[uVar5].bitrate_lower + uVar6 >> 1;
          }
        }
      }
      else {
        lVar7 = vf->offsets[uVar5 + 1];
        lVar3 = vf->dataoffsets[uVar5];
        dVar9 = ov_time_total(vf,i_00);
        dVar9 = rint((double)((lVar7 - lVar3) * 8) / dVar9);
        uVar6 = (ulong)dVar9;
      }
      return uVar6;
    }
  }
  return -0x83;
}

Assistant:

long ov_bitrate(OggVorbis_File *vf,int i){
  if(vf->ready_state<OPENED)return(OV_EINVAL);
  if(i>=vf->links)return(OV_EINVAL);
  if(!vf->seekable && i!=0)return(ov_bitrate(vf,0));
  if(i<0){
    ogg_int64_t bits=0;
    int i;
    float br;
    for(i=0;i<vf->links;i++)
      bits+=(vf->offsets[i+1]-vf->dataoffsets[i])*8;
    /* This once read: return(rint(bits/ov_time_total(vf,-1)));
     * gcc 3.x on x86 miscompiled this at optimisation level 2 and above,
     * so this is slightly transformed to make it work.
     */
    br = bits/ov_time_total(vf,-1);
    return(rint(br));
  }else{
    if(vf->seekable){
      /* return the actual bitrate */
      return(rint((vf->offsets[i+1]-vf->dataoffsets[i])*8/ov_time_total(vf,i)));
    }else{
      /* return nominal if set */
      if(vf->vi[i].bitrate_nominal>0){
        return vf->vi[i].bitrate_nominal;
      }else{
        if(vf->vi[i].bitrate_upper>0){
          if(vf->vi[i].bitrate_lower>0){
            return (vf->vi[i].bitrate_upper+vf->vi[i].bitrate_lower)/2;
          }else{
            return vf->vi[i].bitrate_upper;
          }
        }
        return(OV_FALSE);
      }
    }
  }
}